

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader::~LibraryEffectsLoader(LibraryEffectsLoader *this)

{
  (this->super_LibraryImagesLoader).super_FilePartLoader.super_IFilePartLoader.super_ExtraDataLoader
  ._vptr_ExtraDataLoader = (_func_int **)&PTR__LibraryEffectsLoader_0095f050;
  std::__cxx11::string::~string((string *)&this->mSecondKey);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSamplersMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSidSamplerInfoMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~_Rb_tree(&(this->mEffectSidSamplerInfoMap)._M_t);
  std::__cxx11::string::~string((string *)&this->mCurrentSamplerSource);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSidSurfaceMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~_Rb_tree(&(this->mEffectSidSurfaceMap)._M_t);
  std::__cxx11::string::~string((string *)&this->mCurrentSurfaceInitFrom);
  COLLADAFW::UniqueId::~UniqueId(&(this->mCurrentSurface).imageUniqueId);
  std::__cxx11::string::~string((string *)&this->mCurrentNewParamSid);
  COLLADAFW::FloatOrParam::~FloatOrParam(&this->mTransparency);
  COLLADAFW::ColorOrTexture::~ColorOrTexture(&this->mTransparent);
  LibraryImagesLoader::~LibraryImagesLoader(&this->super_LibraryImagesLoader);
  return;
}

Assistant:

LibraryEffectsLoader::~LibraryEffectsLoader()
	{
	}